

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void realpath_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 local_420;
  size_t test_file_abs_size;
  char test_file_abs_buf [1024];
  uv_fs_t *req_local;
  
  local_420 = 0x400;
  if (req->fs_type != UV_FS_REALPATH) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe0,"req->fs_type == UV_FS_REALPATH");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xeb,"req->result == 0");
    abort();
  }
  uv_cwd(&test_file_abs_size,&local_420);
  strcat((char *)&test_file_abs_size,"/test_file");
  iVar1 = strcmp((char *)req->ptr,(char *)&test_file_abs_size);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf3,"strcmp(req->ptr, test_file_abs_buf) == 0");
    abort();
  }
  realpath_cb_count = realpath_cb_count + 1;
  uv_fs_req_cleanup(req);
  return;
}

Assistant:

static void realpath_cb(uv_fs_t* req) {
  char test_file_abs_buf[PATHMAX];
  size_t test_file_abs_size = sizeof(test_file_abs_buf);
  ASSERT(req->fs_type == UV_FS_REALPATH);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req->result == UV_ENOSYS) {
    realpath_cb_count++;
    uv_fs_req_cleanup(req);
    return;
  }
#endif
  ASSERT(req->result == 0);

  uv_cwd(test_file_abs_buf, &test_file_abs_size);
#ifdef _WIN32
  strcat(test_file_abs_buf, "\\test_file");
  ASSERT(stricmp(req->ptr, test_file_abs_buf) == 0);
#else
  strcat(test_file_abs_buf, "/test_file");
  ASSERT(strcmp(req->ptr, test_file_abs_buf) == 0);
#endif
  realpath_cb_count++;
  uv_fs_req_cleanup(req);
}